

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O2

bool __thiscall Klex::nextChar(Klex *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = fgetc((FILE *)this->file);
  this->currentChar = iVar1;
  skipComment(this);
  iVar1 = this->currentChar;
  iVar2 = isalpha(iVar1);
  if ((iVar1 == 0x5f) || (iVar2 != 0)) {
    this->charClass = LETTER;
  }
  else if (iVar1 - 0x30U < 10) {
    this->charClass = DIGIT;
  }
  else if (iVar1 == 0x22) {
    this->charClass = DOUBLE_QUOTE;
  }
  else if (iVar1 == 0x27) {
    this->charClass = SINGLE_QUOTE;
  }
  else {
    this->charClass = OTHER;
  }
  this->colNum = this->colNum + 1;
  return iVar1 != -1;
}

Assistant:

bool Klex::nextChar() {
    currentChar = fgetc(file);

    skipComment();

    if(isalpha(currentChar) || currentChar == '_') {
        charClass = CharClass::LETTER;
    } else if(isdigit(currentChar)) {
        charClass = CharClass::DIGIT;
    } else if(currentChar == '\'') {
        charClass = CharClass::SINGLE_QUOTE;
    } else if(currentChar == '"') {
        charClass = CharClass::DOUBLE_QUOTE;
    } else {
        charClass = CharClass::OTHER;
    }

    colNum++;
    return currentChar != EOF;
}